

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmax_distance.cpp
# Opt level: O1

double __thiscall
ProbabEstimator::getProbabGtFast1
          (ProbabEstimator *this,double minValInRetained,int numReplaced,int pathLength)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  double dVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [64];
  double vals [20];
  double adStack_c0 [3];
  long alStack_a8 [19];
  
  adStack_c0[0] = 5.29517820324231e-318;
  dVar12 = DistribFunction::getDistrib(this->distribFunction,minValInRetained);
  adStack_c0[1] = 1.0;
  if (-1 < numReplaced) {
    uVar3 = 0;
    dVar13 = 1.0;
    iVar6 = pathLength;
    do {
      adStack_c0[uVar3 + 1] = dVar13;
      uVar3 = uVar3 + 1;
      dVar13 = (dVar13 * (double)iVar6) / (double)(int)uVar3;
      iVar6 = iVar6 + -1;
    } while (numReplaced + 1 != uVar3);
  }
  if (0 < numReplaced) {
    uVar3 = 1;
    dVar13 = 1.0 - dVar12;
    do {
      adStack_c0[uVar3 + 1] = dVar13 * adStack_c0[uVar3 + 1];
      dVar13 = dVar13 * (1.0 - dVar12);
      uVar3 = uVar3 + 1;
    } while (numReplaced + 1 != uVar3);
  }
  dVar13 = 1.0;
  uVar7 = pathLength - numReplaced;
  dVar14 = dVar12;
  if (uVar7 != 0) {
    do {
      dVar13 = (double)((ulong)((byte)uVar7 & 1) * (long)(dVar14 * dVar13) +
                       (ulong)!(bool)((byte)uVar7 & 1) * (long)dVar13);
      bVar1 = 1 < uVar7;
      uVar7 = (int)uVar7 >> 1;
      dVar14 = dVar14 * dVar14;
    } while (bVar1);
  }
  if (-1 < numReplaced) {
    lVar4 = (ulong)(uint)numReplaced + 1;
    do {
      adStack_c0[lVar4] = dVar13 * adStack_c0[lVar4];
      dVar13 = dVar13 * dVar12;
      lVar5 = lVar4 + -1;
      bVar1 = 0 < lVar4;
      lVar4 = lVar5;
    } while (lVar5 != 0 && bVar1);
  }
  if (numReplaced < 0) {
    dVar12 = 1.0;
  }
  else {
    auVar9 = vpbroadcastq_avx512f();
    uVar3 = 0;
    auVar10 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar11 = ZEXT1664(ZEXT816(0x3ff0000000000000));
    do {
      auVar15 = auVar11;
      auVar11 = vpbroadcastq_avx512f();
      auVar11 = vporq_avx512f(auVar11,auVar10);
      uVar2 = vpcmpuq_avx512f(auVar11,auVar9,2);
      auVar11._8_8_ = (ulong)((byte)(uVar2 >> 1) & 1) * alStack_a8[uVar3 - 1];
      auVar11._0_8_ = (ulong)((byte)uVar2 & 1) * (long)adStack_c0[uVar3 + 1];
      auVar11._16_8_ = (ulong)((byte)(uVar2 >> 2) & 1) * alStack_a8[uVar3];
      auVar11._24_8_ = (ulong)((byte)(uVar2 >> 3) & 1) * alStack_a8[uVar3 + 1];
      auVar11._32_8_ = (ulong)((byte)(uVar2 >> 4) & 1) * alStack_a8[uVar3 + 2];
      auVar11._40_8_ = (ulong)((byte)(uVar2 >> 5) & 1) * alStack_a8[uVar3 + 3];
      auVar11._48_8_ = (ulong)((byte)(uVar2 >> 6) & 1) * alStack_a8[uVar3 + 4];
      auVar11._56_8_ = (uVar2 >> 7) * alStack_a8[uVar3 + 5];
      auVar11 = vsubpd_avx512f(auVar15,auVar11);
      uVar3 = uVar3 + 8;
    } while ((numReplaced & 0x7ffffff8U) + 8 != uVar3);
    bVar1 = (bool)((byte)uVar2 & 1);
    auVar9._0_8_ = (ulong)bVar1 * auVar11._0_8_ | (ulong)!bVar1 * auVar15._0_8_;
    bVar1 = (bool)((byte)(uVar2 >> 1) & 1);
    auVar9._8_8_ = (ulong)bVar1 * auVar11._8_8_ | (ulong)!bVar1 * auVar15._8_8_;
    bVar1 = (bool)((byte)(uVar2 >> 2) & 1);
    auVar9._16_8_ = (ulong)bVar1 * auVar11._16_8_ | (ulong)!bVar1 * auVar15._16_8_;
    bVar1 = (bool)((byte)(uVar2 >> 3) & 1);
    auVar9._24_8_ = (ulong)bVar1 * auVar11._24_8_ | (ulong)!bVar1 * auVar15._24_8_;
    bVar1 = (bool)((byte)(uVar2 >> 4) & 1);
    auVar9._32_8_ = (ulong)bVar1 * auVar11._32_8_ | (ulong)!bVar1 * auVar15._32_8_;
    bVar1 = (bool)((byte)(uVar2 >> 5) & 1);
    auVar9._40_8_ = (ulong)bVar1 * auVar11._40_8_ | (ulong)!bVar1 * auVar15._40_8_;
    bVar1 = (bool)((byte)(uVar2 >> 6) & 1);
    auVar9._48_8_ = (ulong)bVar1 * auVar11._48_8_ | (ulong)!bVar1 * auVar15._48_8_;
    auVar9._56_8_ = (uVar2 >> 7) * auVar11._56_8_ | (ulong)!SUB81(uVar2 >> 7,0) * auVar15._56_8_;
    auVar8 = vextractf64x4_avx512f(auVar9,1);
    auVar11 = vaddpd_avx512f(auVar9,ZEXT3264(auVar8));
    dVar12 = auVar11._0_8_ + auVar11._16_8_ + auVar11._8_8_ + auVar11._24_8_;
  }
  return dVar12;
}

Assistant:

double ProbabEstimator::getProbabGtFast1( const double minValInRetained, const int numReplaced, const int pathLength ){

    double  PAr = distribFunction->getDistrib( minValInRetained );
    double cPAr = 1.0-PAr;
    double vals[20]; vals[0] = 1.0;

    double val = 1.0;
    for ( int i = 0; i <= numReplaced; ++i ){ vals[i] = val; val *= (double)(pathLength-i)/(double)(i+1); }
    val = cPAr; 
    for ( int i = 1; i <= numReplaced; ++i ){ vals[i] *= val; val *= cPAr; }
    val = pown( PAr, pathLength-numReplaced );
    for ( int i = numReplaced; i >= 0; --i ){ vals[i] *= val; val *= PAr; }
    val = 1.0;
    for ( int i = 0; i <= numReplaced; ++i ) val -= vals[i];
    return val;
}